

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O0

Clifford * operator%(Clifford *__return_storage_ptr__,Clifford *A,Clifford *B)

{
  float fVar1;
  bool bVar2;
  pointer pBVar3;
  Blade local_7c;
  int local_74;
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> _Stack_70;
  int i_1;
  Blade *local_68;
  float local_5c;
  float local_58;
  float c;
  int q;
  int bm;
  float local_44;
  iterator iStack_40;
  int am;
  idx b;
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> local_30;
  idx a;
  int i;
  Clifford *B_local;
  Clifford *A_local;
  Clifford *R;
  
  a._M_current._7_1_ = 0;
  std::vector<Blade,_std::allocator<Blade>_>::vector(__return_storage_ptr__);
  for (a._M_current._0_4_ = 0; (int)a._M_current < dim; a._M_current._0_4_ = (int)a._M_current + 1)
  {
    Re[(int)a._M_current] = 0.0;
  }
  local_30._M_current = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::begin(A);
  while( true ) {
    b._M_current = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::end(A);
    bVar2 = __gnu_cxx::operator!=(&local_30,&b);
    if (!bVar2) break;
    iStack_40 = std::vector<Blade,_std::allocator<Blade>_>::begin(B);
    pBVar3 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
             operator->(&local_30);
    local_44 = (float)pBVar3->mBase;
    while( true ) {
      _q = std::vector<Blade,_std::allocator<Blade>_>::end(B);
      bVar2 = __gnu_cxx::operator!=
                        (&stack0xffffffffffffffc0,
                         (__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> *)
                         &q);
      if (!bVar2) break;
      pBVar3 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
               operator->(&stack0xffffffffffffffc0);
      c = (float)pBVar3->mBase;
      local_58 = (float)((uint)local_44 & (uint)c);
      pBVar3 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
               operator->(&local_30);
      fVar1 = pBVar3->mVal;
      pBVar3 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
               operator->(&stack0xffffffffffffffc0);
      local_5c = fVar1 * pBVar3->mVal;
      if ((((1e-06 < local_5c) || (local_5c < -1e-06)) && (local_58 != local_44)) &&
         ((local_58 != c && (local_58 != 0.0)))) {
        Re[(int)((uint)local_44 ^ (uint)c)] =
             (float)signs[(int)local_44][(int)c] * local_5c + Re[(int)((uint)local_44 ^ (uint)c)];
      }
      local_68 = (Blade *)__gnu_cxx::
                          __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
                          operator++(&stack0xffffffffffffffc0,0);
    }
    _Stack_70 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
                operator++(&local_30,0);
  }
  for (local_74 = 0; local_74 < dim; local_74 = local_74 + 1) {
    if ((Re[local_74] != 0.0) || (NAN(Re[local_74]))) {
      Blade::Blade(&local_7c,local_74,Re[local_74]);
      std::vector<Blade,_std::allocator<Blade>_>::push_back(__return_storage_ptr__,&local_7c);
      Blade::~Blade(&local_7c);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Clifford operator%(Clifford A, Clifford B)
{
   Clifford R;
   //double *Re=new double[dim];
   for(int i=0;i<dim;i++)Re[i]=0;

    idx a=A.begin();
	while(a!=A.end())
	{
		idx b=B.begin();
		int am=a->mBase;
		while(b!=B.end())
		{
			int bm=b->mBase;
			int q=am&bm;
			float c=(a->mVal)*(b->mVal);
			if((c>Error2||c<(-Error2))&&((q!=am)&&(q!=bm)&&(q!=0)))
			{
				//int sig=sign2(am,bm);
				//Re[am^bm]+=sig*c;
				Re[am^bm]+=signs[am][bm]*c;
			}
			b++;
		}
		a++;
	}
	
   for(int i=0;i<dim;i++)
   {if(Re[i]!=0){R.push_back(Blade(i,Re[i]));}}
  
  //delete Re;
  return R;
}